

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O3

int run_test_thread_mutex(void)

{
  int iVar1;
  undefined8 *extraout_RDX;
  uv_rwlock_t *unaff_RBX;
  int iVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_mutex_t mutex;
  undefined1 auStack_190 [16];
  code *pcStack_180;
  long lStack_178;
  long lStack_170;
  undefined1 auStack_168 [16];
  uv_cond_t *puStack_158;
  long lStack_150;
  long lStack_148;
  uv_rwlock_t *puStack_140;
  long lStack_f8;
  uv_rwlock_t *puStack_f0;
  undefined8 uStack_e0;
  long lStack_d8;
  undefined1 auStack_d0 [56];
  uv_rwlock_t *puStack_98;
  undefined8 uStack_88;
  long lStack_80;
  undefined1 auStack_78 [40];
  undefined1 local_30 [40];
  
  iVar1 = uv_mutex_init(local_30);
  if (iVar1 == 0) {
    uv_mutex_lock(local_30);
    uv_mutex_unlock(local_30);
    uv_mutex_destroy(local_30);
    return 0;
  }
  run_test_thread_mutex_cold_1();
  puStack_98 = (uv_rwlock_t *)0x1ae26a;
  iVar1 = uv_mutex_init_recursive(auStack_78);
  lStack_80 = (long)iVar1;
  uStack_88 = 0;
  if (lStack_80 == 0) {
    unaff_RBX = (uv_rwlock_t *)auStack_78;
    puStack_98 = (uv_rwlock_t *)0x1ae293;
    uv_mutex_lock(unaff_RBX);
    puStack_98 = (uv_rwlock_t *)0x1ae29b;
    uv_mutex_lock(unaff_RBX);
    puStack_98 = (uv_rwlock_t *)0x1ae2a3;
    iVar1 = uv_mutex_trylock(unaff_RBX);
    lStack_80 = (long)iVar1;
    uStack_88 = 0;
    if (lStack_80 == 0) {
      puStack_98 = (uv_rwlock_t *)0x1ae2cc;
      uv_mutex_unlock(auStack_78);
      puStack_98 = (uv_rwlock_t *)0x1ae2d4;
      uv_mutex_unlock(auStack_78);
      puStack_98 = (uv_rwlock_t *)0x1ae2dc;
      uv_mutex_unlock(auStack_78);
      puStack_98 = (uv_rwlock_t *)0x1ae2e4;
      uv_mutex_destroy(auStack_78);
      return 0;
    }
  }
  else {
    puStack_98 = (uv_rwlock_t *)0x1ae2fb;
    run_test_thread_mutex_recursive_cold_1();
  }
  puStack_98 = (uv_rwlock_t *)run_test_thread_rwlock;
  run_test_thread_mutex_recursive_cold_2();
  puStack_f0 = (uv_rwlock_t *)0x1ae319;
  puStack_98 = unaff_RBX;
  iVar1 = uv_rwlock_init(auStack_d0);
  lStack_d8 = (long)iVar1;
  uStack_e0 = 0;
  if (lStack_d8 == 0) {
    puStack_f0 = (uv_rwlock_t *)0x1ae342;
    uv_rwlock_rdlock(auStack_d0);
    puStack_f0 = (uv_rwlock_t *)0x1ae34a;
    uv_rwlock_rdunlock(auStack_d0);
    puStack_f0 = (uv_rwlock_t *)0x1ae352;
    uv_rwlock_wrlock(auStack_d0);
    puStack_f0 = (uv_rwlock_t *)0x1ae35a;
    uv_rwlock_wrunlock(auStack_d0);
    puStack_f0 = (uv_rwlock_t *)0x1ae362;
    uv_rwlock_destroy(auStack_d0);
    return 0;
  }
  puStack_f0 = (uv_rwlock_t *)run_test_thread_rwlock_trylock;
  run_test_thread_rwlock_cold_1();
  puStack_f0 = unaff_RBX;
  iVar1 = uv_cond_init(&condvar);
  lStack_f8 = (long)iVar1;
  if (lStack_f8 == 0) {
    iVar1 = uv_mutex_init(&::mutex);
    lStack_f8 = (long)iVar1;
    if (lStack_f8 != 0) goto LAB_001ae5f3;
    iVar1 = uv_rwlock_init(&rwlock);
    lStack_f8 = (long)iVar1;
    if (lStack_f8 != 0) goto LAB_001ae602;
    uv_mutex_lock(&::mutex);
    iVar1 = uv_thread_create(&lStack_f8,thread_rwlock_trylock_peer,0);
    if (iVar1 != 0) goto LAB_001ae611;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae620;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae62f;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae63e;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae64d;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae65c;
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae66b;
    synchronize();
    iVar1 = uv_thread_join(&lStack_f8);
    if (iVar1 == 0) {
      uv_rwlock_destroy(&rwlock);
      uv_mutex_unlock(&::mutex);
      uv_mutex_destroy(&::mutex);
      uv_cond_destroy(&condvar);
      return 0;
    }
  }
  else {
    run_test_thread_rwlock_trylock_cold_1();
LAB_001ae5f3:
    run_test_thread_rwlock_trylock_cold_2();
LAB_001ae602:
    run_test_thread_rwlock_trylock_cold_3();
LAB_001ae611:
    run_test_thread_rwlock_trylock_cold_4();
LAB_001ae620:
    run_test_thread_rwlock_trylock_cold_5();
LAB_001ae62f:
    run_test_thread_rwlock_trylock_cold_6();
LAB_001ae63e:
    run_test_thread_rwlock_trylock_cold_7();
LAB_001ae64d:
    run_test_thread_rwlock_trylock_cold_8();
LAB_001ae65c:
    run_test_thread_rwlock_trylock_cold_9();
LAB_001ae66b:
    run_test_thread_rwlock_trylock_cold_10();
  }
  run_test_thread_rwlock_trylock_cold_11();
  uv_mutex_lock(&::mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae7f8;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae805;
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae812;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae81f;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_rdunlock(&rwlock);
      step = step + 1;
      uv_cond_signal(&condvar);
      iVar1 = uv_mutex_unlock(&::mutex);
      return iVar1;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_001ae7f8:
    thread_rwlock_trylock_peer_cold_2();
LAB_001ae805:
    thread_rwlock_trylock_peer_cold_3();
LAB_001ae812:
    thread_rwlock_trylock_peer_cold_4();
LAB_001ae81f:
    thread_rwlock_trylock_peer_cold_5();
  }
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  puStack_158 = (uv_cond_t *)0x1ae857;
  puStack_140 = unaff_RBX;
  uv_cond_signal(&condvar);
  iVar1 = step;
  lStack_150 = (long)step;
  do {
    puStack_158 = (uv_cond_t *)0x1ae870;
    uv_cond_wait(&condvar,&::mutex);
    lStack_148 = (long)step;
  } while (iVar1 == step);
  lStack_150 = lStack_150 + 1;
  if (lStack_148 == lStack_150) {
    return step;
  }
  puStack_158 = (uv_cond_t *)0x1ae8aa;
  synchronize_cold_1();
  puStack_158 = &condvar;
  iVar2 = (int)&lStack_178;
  pcStack_180 = (code *)0x1ae8c7;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_168);
  lStack_170 = (long)iVar1;
  lStack_178 = 0;
  if (lStack_170 == 0) {
    pcStack_180 = (code *)0x1ae8f1;
    iVar1 = uv_loop_init(&loop);
    lStack_170 = (long)iVar1;
    lStack_178 = 0;
    if (lStack_170 != 0) goto LAB_001aea97;
    pcStack_180 = (code *)0x1ae922;
    iVar1 = uv_tcp_init(&loop,&tcp_client);
    lStack_170 = (long)iVar1;
    lStack_178 = 0;
    if (lStack_170 != 0) goto LAB_001aeaa4;
    pcStack_180 = (code *)0x1ae95f;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,auStack_168,connect_cb);
    lStack_170 = (long)iVar1;
    lStack_178 = 0;
    if (lStack_170 != 0) goto LAB_001aeab1;
    pcStack_180 = (code *)0x1ae98b;
    iVar1 = uv_run(&loop,0);
    lStack_170 = (long)iVar1;
    lStack_178 = 0;
    if (lStack_170 != 0) goto LAB_001aeabe;
    lStack_170 = 1;
    lStack_178 = (long)connect_cb_called;
    if (lStack_178 != 1) goto LAB_001aeacb;
    lStack_170 = 1;
    lStack_178 = (long)read_cb_called;
    if (lStack_178 != 1) goto LAB_001aead8;
    lStack_170 = 1;
    lStack_178 = (long)write_cb_called;
    if (lStack_178 != 1) goto LAB_001aeae5;
    lStack_170 = 1;
    lStack_178 = (long)close_cb_called;
    if (lStack_178 != 1) goto LAB_001aeaf2;
    pcStack_180 = (code *)0x1aea4d;
    uv_walk(&loop,close_walk_cb,0);
    pcStack_180 = (code *)0x1aea57;
    uv_run(&loop,0);
    lStack_170 = 0;
    pcStack_180 = (code *)0x1aea68;
    iVar1 = uv_loop_close(&loop);
    lStack_178 = (long)iVar1;
    if (lStack_170 == lStack_178) {
      pcStack_180 = (code *)0x1aea82;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_180 = (code *)0x1aea97;
    run_test_not_readable_nor_writable_on_read_error_cold_1();
LAB_001aea97:
    pcStack_180 = (code *)0x1aeaa4;
    run_test_not_readable_nor_writable_on_read_error_cold_2();
LAB_001aeaa4:
    pcStack_180 = (code *)0x1aeab1;
    run_test_not_readable_nor_writable_on_read_error_cold_3();
LAB_001aeab1:
    pcStack_180 = (code *)0x1aeabe;
    run_test_not_readable_nor_writable_on_read_error_cold_4();
LAB_001aeabe:
    pcStack_180 = (code *)0x1aeacb;
    run_test_not_readable_nor_writable_on_read_error_cold_5();
LAB_001aeacb:
    pcStack_180 = (code *)0x1aead8;
    run_test_not_readable_nor_writable_on_read_error_cold_6();
LAB_001aead8:
    pcStack_180 = (code *)0x1aeae5;
    run_test_not_readable_nor_writable_on_read_error_cold_7();
LAB_001aeae5:
    pcStack_180 = (code *)0x1aeaf2;
    run_test_not_readable_nor_writable_on_read_error_cold_8();
LAB_001aeaf2:
    pcStack_180 = (code *)0x1aeaff;
    run_test_not_readable_nor_writable_on_read_error_cold_9();
  }
  pcStack_180 = connect_cb;
  run_test_not_readable_nor_writable_on_read_error_cold_10();
  connect_cb_called = connect_cb_called + 1;
  auStack_190._0_8_ = SEXT48(iVar2);
  if (auStack_190._0_8_ == 0) {
    iVar1 = uv_read_start(&tcp_client,alloc_cb,read_cb);
    auStack_190._0_8_ = SEXT48(iVar1);
    if (auStack_190._0_8_ == 0) {
      auStack_190 = uv_buf_init(reset_me_cmd,3);
      iVar1 = uv_write(&write_req,&tcp_client,auStack_190,1,write_cb);
      pcStack_180 = (code *)0x0;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001aebeb;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001aebeb:
  connect_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x40;
  return 0x36e800;
}

Assistant:

TEST_IMPL(thread_mutex) {
  uv_mutex_t mutex;
  int r;

  r = uv_mutex_init(&mutex);
  ASSERT_OK(r);

  uv_mutex_lock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);

  return 0;
}